

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pbVar1;
  pointer pbVar2;
  ostream *poVar3;
  iterator __begin2;
  pointer pbVar4;
  pointer pbVar5;
  
  synAnalysis();
  pbVar1 = outputErr_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = outputErr_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (outputErr_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      outputErr_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    copyPropagation();
    copyPropagation();
    multiSimplifier();
    copyPropagation();
    changeSameName();
    counterTempVar();
    allocateRegisterForGlobalVar();
    outputIntermediateCode();
    pbVar1 = intermediateCode_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = intermediateCode_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      poVar3 = std::operator<<((ostream *)midGross,(string *)pbVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    generateMIPSAssembly();
    pbVar1 = mipsCode_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = mipsCode_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = mipsCode_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pbVar5 = mipsCode_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
      poVar3 = std::operator<<((ostream *)mips,(string *)pbVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    for (; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
      poVar3 = std::operator<<((ostream *)mipsTest,(string *)pbVar5);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  else {
    for (; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
      poVar3 = std::operator<<((ostream *)err,(string *)pbVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  fclose((FILE *)testfile);
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  return 0;
}

Assistant:

int main() {
    synAnalysis();
    if (outputErr.empty()) {
        copyPropagation();
        copyPropagation();
        multiSimplifier();
        copyPropagation();
        changeSameName();
        counterTempVar();
        allocateRegisterForGlobalVar();
        outputIntermediateCode();
        for (auto &outputAn : intermediateCode) {
            midGross << outputAn << endl;
        }
        generateMIPSAssembly();
        for (auto &outputAn : mipsCode) {
            mips << outputAn << endl;
        }
        for (auto &outputAn : mipsCode) {
            mipsTest << outputAn << endl;
        }
    } else {
        for (auto &outputAn : outputErr) {
            err << outputAn << endl;
        }
    }
    fclose(testfile);
    out.close();
    err.close();
    midGross.close();
    midOptimize.close();
    mips.close();
    return 0;
}